

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_h_predictor_4x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar5 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)left;
  auVar3 = pshuflw(in_XMM1,auVar2,0);
  auVar4 = pshuflw(in_XMM2,auVar2,0x55);
  auVar5 = pshuflw(in_XMM3,auVar2,0xaa);
  auVar2 = pshuflw(auVar2,auVar2,0xff);
  *(long *)dst = auVar3._0_8_;
  puVar1 = dst + stride;
  *(long *)puVar1 = auVar4._0_8_;
  *(long *)(puVar1 + stride) = auVar5._0_8_;
  *(long *)(puVar1 + stride + stride) = auVar2._0_8_;
  return;
}

Assistant:

void aom_highbd_h_predictor_4x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_loadl_epi64((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_storel_epi64((__m128i *)dst, row0);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row1);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row2);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row3);
}